

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_rewriter.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ExpressionRewriter::ConstantOrNull
          (ExpressionRewriter *this,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *children,Value *value)

{
  const_iterator __position;
  reference pvVar1;
  BoundConstantExpression *this_00;
  LogicalType type;
  ScalarFunction func;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1f0;
  LogicalType local_1e8;
  Value local_1d0;
  Value local_190;
  ScalarFunction local_150;
  
  LogicalType::LogicalType(&local_1e8,&value->type_);
  ConstantOrNullFun::GetFunction();
  pvVar1 = vector<duckdb::LogicalType,_true>::operator[]
                     (&local_150.super_BaseScalarFunction.super_SimpleFunction.arguments,0);
  if (pvVar1 != &local_1e8) {
    pvVar1->id_ = local_1e8.id_;
    pvVar1->physical_type_ = local_1e8.physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=(&pvVar1->type_info_,&local_1e8.type_info_);
  }
  local_150.super_BaseScalarFunction.return_type.id_ = local_1e8.id_;
  local_150.super_BaseScalarFunction.return_type.physical_type_ = local_1e8.physical_type_;
  shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
            (&local_150.super_BaseScalarFunction.return_type.type_info_,&local_1e8.type_info_);
  __position._M_current =
       (children->
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ).
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  this_00 = (BoundConstantExpression *)operator_new(0x98);
  Value::Value(&local_1d0,value);
  BoundConstantExpression::BoundConstantExpression(this_00,&local_1d0);
  Value::~Value(&local_1d0);
  local_1f0._M_head_impl = (Expression *)this_00;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::_M_insert_rval(&children->
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ,__position,(value_type *)&local_1f0);
  if ((BoundConstantExpression *)local_1f0._M_head_impl != (BoundConstantExpression *)0x0) {
    (*(((Expression *)&(local_1f0._M_head_impl)->super_BaseExpression)->super_BaseExpression).
      _vptr_BaseExpression[1])();
  }
  Value::Value(&local_190,value);
  duckdb::ConstantOrNull::Bind((ConstantOrNull *)&local_1f0,&local_190);
  make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType&,duckdb::ScalarFunction&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>>
            ((duckdb *)&local_1d0,&local_1e8,&local_150,children,
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             &local_1f0);
  (this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor =
       (_func_int **)local_1d0.type_._0_8_;
  local_1d0.type_.id_ = INVALID;
  local_1d0.type_.physical_type_ = ~INVALID;
  local_1d0.type_._2_6_ = 0;
  if ((BoundConstantExpression *)local_1f0._M_head_impl != (BoundConstantExpression *)0x0) {
    (*(((Expression *)&(local_1f0._M_head_impl)->super_BaseExpression)->super_BaseExpression).
      _vptr_BaseExpression[1])();
  }
  local_1f0._M_head_impl = (Expression *)0x0;
  Value::~Value(&local_190);
  local_150.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02476950;
  if (local_150.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_150.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_150.function.super__Function_base._M_manager)
              ((_Any_data *)&local_150.function,(_Any_data *)&local_150.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_150.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_1e8);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> ExpressionRewriter::ConstantOrNull(vector<unique_ptr<Expression>> children, Value value) {
	auto type = value.type();
	auto func = ConstantOrNullFun::GetFunction();
	func.arguments[0] = type;
	func.return_type = type;
	children.insert(children.begin(), make_uniq<BoundConstantExpression>(value));
	return make_uniq<BoundFunctionExpression>(type, func, std::move(children), ConstantOrNull::Bind(std::move(value)));
}